

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bheap.c
# Opt level: O0

int main(int argc,char **argv)

{
  code *pcVar1;
  uint uVar2;
  int iVar3;
  time_t tVar4;
  sx_alloc *alloc_00;
  sx_bheap *bh_00;
  sx_bheap_item sVar5;
  sx_bheap_item item_3;
  int i_7;
  int k_1;
  int key_1;
  int n_3;
  int i_6;
  sx_bheap_item item_2;
  int i_5;
  int k;
  int key;
  int n_2;
  int i_4;
  int num_pop;
  sx_bheap_item item_1;
  int i_3;
  int n_1;
  int i_2;
  sx_bheap_item item;
  int i_1;
  int n;
  int i;
  sx_bheap *bh;
  sx_alloc *alloc;
  sx_rng rng;
  char **argv_local;
  int argc_local;
  
  rng.state[1] = (uint64_t)argv;
  tVar4 = time((time_t *)0x0);
  sx_rng_seed((sx_rng *)&alloc,(uint32_t)tVar4);
  alloc_00 = sx_alloc_malloc();
  bh_00 = sx_bheap_create(alloc_00,0x20);
  puts("\nPushing values to _MIN_ binary heap:");
  for (i_1 = 0; i_1 < 0x20; i_1 = i_1 + 1) {
    uVar2 = sx_rng_gen_rangei((sx_rng *)&alloc,1,100);
    if (i_1 < 0x1f) {
      printf("%d - ",(ulong)uVar2);
    }
    else {
      printf("%d\n",(ulong)uVar2);
    }
    sx_bheap_push_min(bh_00,uVar2,(void *)0x0);
  }
  puts("Pop: ");
  for (item.user._4_4_ = 0; item.user._4_4_ < 0x20; item.user._4_4_ = item.user._4_4_ + 1) {
    sVar5 = sx_bheap_pop_min(bh_00);
    if (item.user._4_4_ < 0x1f) {
      printf("%d - ",(ulong)(uint)sVar5.key);
    }
    else {
      printf("%d\n",(ulong)(uint)sVar5.key);
    }
  }
  puts("\nPushing values to _MAX_ binary heap:");
  for (i_3 = 0; i_3 < 0x20; i_3 = i_3 + 1) {
    uVar2 = sx_rng_gen_rangei((sx_rng *)&alloc,1,100);
    if (i_3 < 0x1f) {
      printf("%d - ",(ulong)uVar2);
    }
    else {
      printf("%d\n",(ulong)uVar2);
    }
    sx_bheap_push_max(bh_00,uVar2,(void *)0x0);
  }
  puts("Pop: ");
  for (item_1.user._4_4_ = 0; item_1.user._4_4_ < 0x20; item_1.user._4_4_ = item_1.user._4_4_ + 1) {
    sVar5 = sx_bheap_pop_max(bh_00);
    if (item_1.user._4_4_ < 0x1f) {
      printf("%d - ",(ulong)(uint)sVar5.key);
    }
    else {
      printf("%d\n",(ulong)(uint)sVar5.key);
    }
  }
  puts("\nPushing values to _MIN_ binary heap with Random pops during push:");
  n_2 = 0;
  key = 0;
  do {
    if (0x1f < key) {
      puts("Pop Remaining: ");
      for (item_2.user._0_4_ = 0; (int)item_2.user < 0x20 - n_2;
          item_2.user._0_4_ = (int)item_2.user + 1) {
        sVar5 = sx_bheap_pop_min(bh_00);
        printf("%d - ",(ulong)(uint)sVar5.key);
      }
      puts("");
      puts("\nPushing values to _MAX_ binary heap with Random pops during push:");
      key_1 = 0;
      do {
        if (0x1f < key_1) {
          puts("Pop Remaining: ");
          for (item_3.user._0_4_ = 0; (int)item_3.user < 0x20 - n_2;
              item_3.user._0_4_ = (int)item_3.user + 1) {
            sVar5 = sx_bheap_pop_max(bh_00);
            printf("%d - ",(ulong)(uint)sVar5.key);
          }
          puts("");
          return 0;
        }
        uVar2 = sx_rng_gen_rangei((sx_rng *)&alloc,1,100);
        if (key_1 < 0x1f) {
          printf("%d - ",(ulong)uVar2);
        }
        else {
          printf("%d\n",(ulong)uVar2);
        }
        sx_bheap_push_max(bh_00,uVar2,(void *)0x0);
        iVar3 = sx_rng_gen_rangei((sx_rng *)&alloc,1,100);
        if (iVar3 < 0x32) {
          sVar5 = sx_bheap_pop_max(bh_00);
          for (item_3.user._4_4_ = 0; item_3.user._4_4_ < bh_00->count;
              item_3.user._4_4_ = item_3.user._4_4_ + 1) {
            if (sVar5.key < bh_00->items[item_3.user._4_4_].key) {
              sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-bheap.c"
                                ,0x5d,"key >= bh->items[k].key");
              pcVar1 = (code *)swi(3);
              iVar3 = (*pcVar1)();
              return iVar3;
            }
          }
          n_2 = n_2 + 1;
        }
        key_1 = key_1 + 1;
      } while( true );
    }
    uVar2 = sx_rng_gen_rangei((sx_rng *)&alloc,1,100);
    if (key < 0x1f) {
      printf("%d - ",(ulong)uVar2);
    }
    else {
      printf("%d\n",(ulong)uVar2);
    }
    sx_bheap_push_min(bh_00,uVar2,(void *)0x0);
    iVar3 = sx_rng_gen_rangei((sx_rng *)&alloc,1,100);
    if (iVar3 < 0x32) {
      sVar5 = sx_bheap_pop_min(bh_00);
      for (item_2.user._4_4_ = 0; item_2.user._4_4_ < bh_00->count;
          item_2.user._4_4_ = item_2.user._4_4_ + 1) {
        if (bh_00->items[item_2.user._4_4_].key < sVar5.key) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-bheap.c"
                            ,0x45,"key <= bh->items[k].key");
          pcVar1 = (code *)swi(3);
          iVar3 = (*pcVar1)();
          return iVar3;
        }
      }
      n_2 = n_2 + 1;
    }
    key = key + 1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    static const int N = 32;

    sx_rng rng;
    sx_rng_seed(&rng, (uint32_t)time(NULL));

    const sx_alloc* alloc = sx_alloc_malloc();
    sx_bheap* bh = sx_bheap_create(alloc, N);

    puts("\nPushing values to _MIN_ binary heap:");
    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_min(bh, n, 0);
    }

    puts("Pop: ");
    for (int i = 0; i < N; i++) {
        sx_bheap_item item = sx_bheap_pop_min(bh);
        if (i < N - 1)
            printf("%d - ", item.key);
        else
            printf("%d\n", item.key);
    }

    puts("\nPushing values to _MAX_ binary heap:");
    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_max(bh, n, 0);
    }

    puts("Pop: ");
    for (int i = 0; i < N; i++) {
        sx_bheap_item item = sx_bheap_pop_max(bh);
        if (i < N - 1)
            printf("%d - ", item.key);
        else
            printf("%d\n", item.key);
    }

    puts("\nPushing values to _MIN_ binary heap with Random pops during push:");
    int num_pop = 0;

    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_min(bh, n, 0);

        if (sx_rng_gen_rangei(&rng, 1, 100) < 50) {
            int key = sx_bheap_pop_min(bh).key;
            for (int k = 0; k < bh->count; k++) sx_assert(key <= bh->items[k].key);
            num_pop++;
        }
    }

    puts("Pop Remaining: ");
    for (int i = 0; i < N - num_pop; i++) {
        sx_bheap_item item = sx_bheap_pop_min(bh);
        printf("%d - ", item.key);
    }
    puts("");

    puts("\nPushing values to _MAX_ binary heap with Random pops during push:");

    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_max(bh, n, 0);

        if (sx_rng_gen_rangei(&rng, 1, 100) < 50) {
            int key = sx_bheap_pop_max(bh).key;
            for (int k = 0; k < bh->count; k++) sx_assert(key >= bh->items[k].key);
            num_pop++;
        }
    }

    puts("Pop Remaining: ");
    for (int i = 0; i < N - num_pop; i++) {
        sx_bheap_item item = sx_bheap_pop_max(bh);
        printf("%d - ", item.key);
    }
    puts("");

    return 0;
}